

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::CheckElementShapeDimension(TPZCheckMesh *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TPZCompEl **ppTVar6;
  long *plVar7;
  long lVar8;
  ostream *poVar9;
  TPZConnect *pTVar10;
  int iVar11;
  ulong uVar12;
  ulong nelem;
  int local_4c;
  
  uVar1 = (uint)(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nelem = 0;
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = nelem;
  }
  local_4c = 0;
  for (; nelem != uVar12; nelem = nelem + 1) {
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if ((*ppTVar6 != (TPZCompEl *)0x0) &&
       (plVar7 = (long *)__dynamic_cast(*ppTVar6,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0), plVar7 != (long *)0x0)
       ) {
      iVar3 = (**(code **)(*plVar7 + 0x90))(plVar7);
      iVar11 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar3 != iVar11; iVar11 = iVar11 + 1) {
        iVar4 = (**(code **)(*plVar7 + 0xa0))(plVar7,iVar11);
        lVar8 = (**(code **)(*plVar7 + 0xa8))(plVar7,iVar11);
        iVar5 = (**(code **)(*plVar7 + 0x260))(plVar7,iVar11,*(undefined1 *)(lVar8 + 0x14));
        if (*(int *)(lVar8 + 0x18) != iVar5) {
          poVar9 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)nelem);
          poVar9 = std::operator<<(poVar9," connect = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
          poVar9 = std::operator<<(poVar9," nshape = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
          poVar9 = std::operator<<(poVar9," c.NShape ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::endl<char,std::char_traits<char>>(poVar9);
          local_4c = 1;
        }
        this->fNState = 1;
        pTVar10 = TPZChunkVector<TPZConnect,_10>::operator[]
                            (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                             (long)iVar4);
        iVar2 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                [(int)pTVar10->fSequenceNumber].dim;
        if (this->fNState * iVar5 != iVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)nelem);
          poVar9 = std::operator<<(poVar9," connect = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
          poVar9 = std::operator<<(poVar9," nshape = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
          poVar9 = std::operator<<(poVar9," blsize ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
          std::endl<char,std::char_traits<char>>(poVar9);
          (**(code **)(*plVar7 + 200))(plVar7,&std::cout);
          local_4c = 1;
        }
      }
    }
  }
  return local_4c;
}

Assistant:

int TPZCheckMesh::CheckElementShapeDimension() {
	int check = 0;
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
		TPZInterpolatedElement *cint = dynamic_cast<TPZInterpolatedElement *> (cel);
		if(!cint) continue;
		int nc = cint->NConnects();
		int ic;
		for(ic=0; ic<nc; ic++) {
			int cind = cint->ConnectIndex(ic);
            TPZConnect &c = cint->Connect(ic);
			int nshape = cint->NConnectShapeF(ic,c.Order());
            if (c.NShape() != nshape) {
                cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
                << cind << " nshape = " << nshape << " c.NShape " << c.NShape() << endl;
                check =1 ;
            }
			fNState = 1;                                                      /// WARNING
			int seqnum = fMesh->ConnectVec()[cind].SequenceNumber();
			int blsize = fMesh->Block().Size(seqnum);
			if(nshape*fNState != blsize) {
				cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
				<< cind << " nshape = " << nshape << " blsize " << blsize << endl;
				cint->Print(cout);
				check = 1;
			}
		}
	}
	return check;
}